

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O2

void serialization::unserialize_helper<serialization::xml_iarchive,std::__cxx11::string,Person>
               (xml_iarchive *ar,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
               *v)

{
  size_type sVar1;
  size_type i;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person> tmp;
  insert_iterator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>_>
  local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  local_78;
  
  sVar1 = xml_iarchive::load_sequence_start(ar);
  for (i = 0; sVar1 != i; i = i + 1) {
    xml_iarchive::load_sequence_item_start(ar,i);
    local_c0.first._M_dataplus._M_p = (pointer)&local_c0.first.field_2;
    local_c0.first._M_string_length = 0;
    local_c0.first.field_2._M_local_buf[0] = '\0';
    local_c0.second.name.field_2._M_allocated_capacity = 0;
    local_c0.second.name.field_2._8_8_ = 0;
    local_c0.second.age = 0;
    local_c0.second._36_4_ = 0;
    local_c0.second.name._M_string_length = 0;
    local_c0.second.name._M_dataplus._M_p = (pointer)&local_c0.second.name.field_2;
    unserialize_helper<serialization::xml_iarchive,std::__cxx11::string,Person>(ar,&local_c0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_true>
              (&local_78,&local_c0);
    local_d0.container = v;
    local_d0.iter._M_node = &(v->_M_t)._M_impl.super__Rb_tree_header._M_header;
    std::
    insert_iterator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>_>
    ::operator=(&local_d0,&local_78);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
    ::~pair(&local_78);
    xml_iarchive::load_sequence_item_end(ar);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>::
    ~pair(&local_c0);
  }
  xml_iarchive::load_sequence_end(ar);
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::map<Key, Value> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        typename std::pair<Key, Value> tmp;
        unserialize_helper(ar, tmp);
        *std::insert_iterator<std::map<Key, Value>>(v, v.end()) = std::move(tmp);
        ar.load_sequence_item_end();
    }
    ar.load_sequence_end();
}